

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

InstId asmjit::v1_14::InstAPI::stringToInstId(Arch arch,char *s,size_t len)

{
  char *in_RDX;
  char in_DIL;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  bool bVar1;
  bool bVar2;
  InstId local_8;
  
  bVar2 = in_DIL == '\x01' || in_DIL == '\x02';
  if (bVar2) {
    local_8 = x86::InstInternal::stringToInstId
                        (in_RDX,CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffde,
                                                        in_stack_ffffffffffffffd8)));
  }
  else {
    bVar1 = in_DIL == '\x06' || in_DIL == '\f';
    if (bVar1) {
      local_8 = a64::InstInternal::stringToInstId
                          (in_RDX,CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd8)));
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

InstId InstAPI::stringToInstId(Arch arch, const char* s, size_t len) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::stringToInstId(s, len);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::stringToInstId(s, len);
#endif

  return 0;
}